

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O2

int run_test_process_ref(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  char *argv [3];
  size_t exepath_size;
  undefined8 local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  uv_process_t h;
  char exepath [256];
  
  argv[2] = (char *)0x0;
  argv[0] = (char *)0x0;
  argv[1] = "spawn_helper4";
  local_1a8 = 0;
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_1b8 = 0;
  uStack_1b0 = 0;
  iVar1 = uv_exepath(exepath);
  if (iVar1 == 0) {
    local_1e0 = 0;
    argv[0] = exepath;
    local_1d8 = exepath;
    local_1d0 = (undefined1 *)argv;
    uVar2 = uv_default_loop();
    iVar1 = uv_spawn(uVar2,&h,&local_1e0);
    if (iVar1 == 0) {
      uv_unref(&h);
      uVar2 = uv_default_loop();
      uv_run(uVar2,0);
      iVar1 = uv_process_kill(&h,0xf);
      if (iVar1 == 0) {
        do_close(&h);
        loop = (uv_loop_t *)uv_default_loop();
        close_loop(loop);
        uVar2 = uv_default_loop();
        iVar1 = uv_loop_close(uVar2);
        if (iVar1 == 0) {
          return 0;
        }
        pcVar3 = "0 == uv_loop_close(uv_default_loop())";
        uVar2 = 0x1af;
      }
      else {
        pcVar3 = "r == 0";
        uVar2 = 0x1ab;
      }
    }
    else {
      pcVar3 = "r == 0";
      uVar2 = 0x1a5;
    }
  }
  else {
    pcVar3 = "r == 0";
    uVar2 = 0x19d;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ref.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(process_ref) {
  /* spawn_helper4 blocks indefinitely. */
  char *argv[] = { NULL, "spawn_helper4", NULL };
  uv_process_options_t options;
  size_t exepath_size;
  char exepath[256];
  uv_process_t h;
  int r;

  memset(&options, 0, sizeof(options));
  exepath_size = sizeof(exepath);

  r = uv_exepath(exepath, &exepath_size);
  ASSERT(r == 0);

  argv[0] = exepath;
  options.file = exepath;
  options.args = argv;
  options.exit_cb = NULL;

  r = uv_spawn(uv_default_loop(), &h, &options);
  ASSERT(r == 0);

  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  r = uv_process_kill(&h, /* SIGTERM */ 15);
  ASSERT(r == 0);

  do_close(&h);

  MAKE_VALGRIND_HAPPY();
  return 0;
}